

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode pausewrite(Curl_easy *data,int type,char *ptr,size_t len)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  
  uVar2 = (data->state).tempcount;
  uVar8 = 0;
  if (uVar2 == 0) {
    bVar3 = true;
  }
  else {
    piVar5 = &(data->state).tempwrite[0].type;
    do {
      bVar3 = *piVar5 != type;
      uVar7 = (uint)uVar8;
      if (*piVar5 == type) break;
      uVar6 = (uint)uVar8 + 1;
      uVar8 = (ulong)uVar6;
      piVar5 = piVar5 + 6;
      uVar7 = uVar2;
    } while (uVar2 != uVar6);
    uVar8 = (ulong)uVar7;
  }
  if (bVar3) {
    pcVar4 = (char *)Curl_memdup(ptr,len);
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (data->state).tempwrite[uVar8].buf = pcVar4;
    (data->state).tempwrite[uVar8].len = len;
    (data->state).tempwrite[uVar8].type = type;
    puVar1 = &(data->state).tempcount;
    *puVar1 = *puVar1 + 1;
  }
  else {
    sVar9 = (data->state).tempwrite[uVar8].len + len;
    pcVar4 = (char *)(*Curl_crealloc)((data->state).tempwrite[uVar8].buf,sVar9);
    if (pcVar4 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pcVar4 + (data->state).tempwrite[uVar8].len,ptr,len);
    (data->state).tempwrite[uVar8].buf = pcVar4;
    (data->state).tempwrite[uVar8].len = sVar9;
  }
  piVar5 = &(data->req).keepon;
  *(byte *)piVar5 = (byte)*piVar5 | 0x10;
  return CURLE_OK;
}

Assistant:

static CURLcode pausewrite(struct Curl_easy *data,
                           int type, /* what type of data */
                           const char *ptr,
                           size_t len)
{
  /* signalled to pause sending on this connection, but since we have data
     we want to send we need to dup it to save a copy for when the sending
     is again enabled */
  struct SingleRequest *k = &data->req;
  struct UrlState *s = &data->state;
  char *dupl;
  unsigned int i;
  bool newtype = TRUE;

  if(s->tempcount) {
    for(i=0; i< s->tempcount; i++) {
      if(s->tempwrite[i].type == type) {
        /* data for this type exists */
        newtype = FALSE;
        break;
      }
    }
    DEBUGASSERT(i < 3);
  }
  else
    i = 0;

  if(!newtype) {
    /* append new data to old data */

    /* figure out the new size of the data to save */
    size_t newlen = len + s->tempwrite[i].len;
    /* allocate the new memory area */
    char *newptr = realloc(s->tempwrite[i].buf, newlen);
    if(!newptr)
      return CURLE_OUT_OF_MEMORY;
    /* copy the new data to the end of the new area */
    memcpy(newptr + s->tempwrite[i].len, ptr, len);

    /* update the pointer and the size */
    s->tempwrite[i].buf = newptr;
    s->tempwrite[i].len = newlen;
  }
  else {
    dupl = Curl_memdup(ptr, len);
    if(!dupl)
      return CURLE_OUT_OF_MEMORY;

    /* store this information in the state struct for later use */
    s->tempwrite[i].buf = dupl;
    s->tempwrite[i].len = len;
    s->tempwrite[i].type = type;

    if(newtype)
      s->tempcount++;
  }

  /* mark the connection as RECV paused */
  k->keepon |= KEEP_RECV_PAUSE;

  DEBUGF(infof(data, "Paused %zu bytes in buffer for type %02x\n",
               len, type));

  return CURLE_OK;
}